

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O2

int uv_fs_fstat(uv_loop_t *loop,uv_fs_t *req,uv_file file,uv_fs_cb cb)

{
  int iVar1;
  int iVar2;
  
  if (req == (uv_fs_t *)0x0) {
    iVar2 = -0x16;
  }
  else {
    req->type = UV_FS;
    req->fs_type = UV_FS_FSTAT;
    req->result = 0;
    req->ptr = (void *)0x0;
    req->loop = loop;
    req->path = (char *)0x0;
    req->new_path = (char *)0x0;
    req->bufs = (uv_buf_t *)0x0;
    req->cb = cb;
    req->file = file;
    if (cb == (uv_fs_cb)0x0) {
      uv__fs_work(&req->work_req);
      iVar2 = (int)req->result;
    }
    else {
      iVar2 = 0;
      iVar1 = uv__iou_fs_statx(loop,req,1,0);
      if (iVar1 == 0) {
        (loop->active_reqs).count = (loop->active_reqs).count + 1;
        uv__work_submit(loop,&req->work_req,UV__WORK_FAST_IO,uv__fs_work,uv__fs_done);
      }
    }
  }
  return iVar2;
}

Assistant:

int uv_fs_fstat(uv_loop_t* loop, uv_fs_t* req, uv_file file, uv_fs_cb cb) {
  INIT(FSTAT);
  req->file = file;
  if (cb != NULL)
    if (uv__iou_fs_statx(loop, req, /* is_fstat */ 1, /* is_lstat */ 0))
      return 0;
  POST;
}